

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O0

void fd_tcp_socket(int *fds)

{
  int iVar1;
  void *local_38;
  void *client_socket;
  int local_24;
  pthread_t pStack_20;
  int conn;
  pthread_t client_thread;
  int *piStack_10;
  int sock;
  int *fds_local;
  
  piStack_10 = fds;
  client_thread._4_4_ = create_bound_socket();
  iVar1 = listen(client_thread._4_4_,5);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x80,"listen(sock, 5) == 0");
  }
  iVar1 = pthread_create(&stack0xffffffffffffffe0,(pthread_attr_t *)0x0,connector_client,(void *)0x0
                        );
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x84,"pthread_create(&client_thread, NULL, connector_client, NULL) == 0");
  }
  client_socket = (void *)0x0;
  local_24 = accept4(client_thread._4_4_,(sockaddr *)0x0,(socklen_t *)0x0,0x80000);
  if (local_24 < 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x8b,"conn >= 0");
  }
  local_38 = (void *)0x0;
  iVar1 = pthread_join(pStack_20,&local_38);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x8f,"pthread_join(client_thread, &client_socket) == 0");
  }
  *piStack_10 = local_24;
  piStack_10[1] = (int)local_38;
  piStack_10[2] = client_thread._4_4_;
  return;
}

Assistant:

static void
fd_tcp_socket(int fds[3])
{
	int sock = create_bound_socket();

	ATF_REQUIRE(listen(sock, 5) == 0);

	pthread_t client_thread;
	ATF_REQUIRE(
	    pthread_create(&client_thread, NULL, connector_client, NULL) == 0);

#ifdef __APPLE__
	int conn = accept(sock, NULL, NULL);
#else
	int conn = accept4(sock, NULL, NULL, SOCK_CLOEXEC);
#endif
	ATF_REQUIRE(conn >= 0);

	void *client_socket = NULL;

	ATF_REQUIRE(pthread_join(client_thread, &client_socket) == 0);

	fds[0] = conn;
	fds[1] = (int)(intptr_t)client_socket;
	fds[2] = sock;
}